

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptGeneratorFunction::GetPropertyQuery
          (JavascriptGeneratorFunction *this,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  PropertyId PVar1;
  ScriptContext *this_00;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  JavascriptGeneratorFunction *this_local;
  
  propertyRecord = (PropertyRecord *)requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)originalInstance;
  originalInstance_local = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)value_local,&local_48);
  if ((local_48 == (PropertyRecord *)0x0) ||
     ((PVar1 = PropertyRecord::GetPropertyId(local_48), PVar1 != 0x1cd &&
      (PVar1 = PropertyRecord::GetPropertyId(local_48), PVar1 != 0x1cf)))) {
    this_local._4_4_ =
         JavascriptFunction::GetPropertyQuery
                   ((JavascriptFunction *)this,propertyNameString_local,
                    (JavascriptString *)value_local,&info_local->m_instance,
                    (PropertyValueInfo *)requestContext_local,(ScriptContext *)propertyRecord);
  }
  else {
    this_local._4_4_ =
         DynamicObject::GetPropertyQuery
                   ((DynamicObject *)this,propertyNameString_local,(JavascriptString *)value_local,
                    &info_local->m_instance,(PropertyValueInfo *)requestContext_local,
                    (ScriptContext *)propertyRecord);
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptGeneratorFunction::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr)
        {
            if (propertyRecord->GetPropertyId() == PropertyIds::caller || propertyRecord->GetPropertyId() == PropertyIds::arguments)
            {
                // JavascriptFunction has special case for caller and arguments; call DynamicObject:: virtual directly to skip that.
                return DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
            }
        }

        return JavascriptFunction::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
    }